

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

Extension * __thiscall
google::protobuf::internal::ExtensionSet::FindOrNull(ExtensionSet *this,int key)

{
  ushort uVar1;
  ulong uVar2;
  Extension *pEVar3;
  _Rb_tree_header *p_Var4;
  KeyValue *pKVar5;
  _Base_ptr p_Var6;
  difference_type __d;
  ulong uVar7;
  _Base_ptr p_Var8;
  
  uVar1 = this->flat_size_;
  if (uVar1 == 0) {
    return (Extension *)0x0;
  }
  if ((short)uVar1 < 0) {
    if (-1 < (short)this->flat_size_) {
      __assert_fail("is_large()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                    ,0x76e,
                    "const ExtensionSet::Extension *google::protobuf::internal::ExtensionSet::FindOrNullInLargeMap(int) const"
                   );
    }
    p_Var6 = (((this->map_).large)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var6 != (_Base_ptr)0x0) {
      p_Var4 = &(((this->map_).large)->_M_t)._M_impl.super__Rb_tree_header;
      p_Var8 = &p_Var4->_M_header;
      do {
        if (key <= (int)p_Var6[1]._M_color) {
          p_Var8 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < key];
      } while (p_Var6 != (_Base_ptr)0x0);
      if ((_Rb_tree_header *)p_Var8 != p_Var4) {
        if (key < (int)p_Var8[1]._M_color) {
          return (Extension *)0x0;
        }
        return (Extension *)&p_Var8[1]._M_parent;
      }
    }
    return (Extension *)0x0;
  }
  pKVar5 = (this->map_).flat;
  uVar7 = (long)((ulong)uVar1 * 0x20 + -0x20) >> 5;
  while (uVar2 = uVar7, 0 < (long)uVar2) {
    uVar7 = uVar2 >> 1;
    if (pKVar5[uVar7].first < key) {
      pKVar5 = pKVar5 + uVar7 + 1;
      uVar7 = ~uVar7 + uVar2;
    }
  }
  pEVar3 = (Extension *)0x0;
  if (pKVar5->first == key) {
    pEVar3 = &pKVar5->second;
  }
  return pEVar3;
}

Assistant:

const ExtensionSet::Extension* ExtensionSet::FindOrNull(int key) const {
  if (flat_size_ == 0) {
    return nullptr;
  } else if (PROTOBUF_PREDICT_TRUE(!is_large())) {
    auto it = std::lower_bound(flat_begin(), flat_end() - 1, key,
                               KeyValue::FirstComparator());
    return it->first == key ? &it->second : nullptr;
  } else {
    return FindOrNullInLargeMap(key);
  }
}